

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O0

void __thiscall
tcu::ThreadUtil::CompareData::CompareData
          (CompareData *this,SharedPtr<tcu::ThreadUtil::DataBlock> *a,
          SharedPtr<tcu::ThreadUtil::DataBlock> *b)

{
  SharedPtr<tcu::ThreadUtil::Object> local_50;
  SharedPtr<tcu::ThreadUtil::Object> local_40 [2];
  SharedPtr<tcu::ThreadUtil::DataBlock> *local_20;
  SharedPtr<tcu::ThreadUtil::DataBlock> *b_local;
  SharedPtr<tcu::ThreadUtil::DataBlock> *a_local;
  CompareData *this_local;
  
  local_20 = b;
  b_local = a;
  a_local = (SharedPtr<tcu::ThreadUtil::DataBlock> *)this;
  Operation::Operation(&this->super_Operation,"CompareData");
  (this->super_Operation)._vptr_Operation = (_func_int **)&PTR__CompareData_032dccf0;
  de::SharedPtr<tcu::ThreadUtil::DataBlock>::SharedPtr(&this->m_a,a);
  de::SharedPtr<tcu::ThreadUtil::DataBlock>::SharedPtr(&this->m_b,b);
  de::SharedPtr<tcu::ThreadUtil::Object>::SharedPtr<tcu::ThreadUtil::DataBlock>(local_40,a);
  Operation::readObject(&this->super_Operation,local_40);
  de::SharedPtr<tcu::ThreadUtil::Object>::~SharedPtr(local_40);
  de::SharedPtr<tcu::ThreadUtil::Object>::SharedPtr<tcu::ThreadUtil::DataBlock>(&local_50,b);
  Operation::readObject(&this->super_Operation,&local_50);
  de::SharedPtr<tcu::ThreadUtil::Object>::~SharedPtr(&local_50);
  return;
}

Assistant:

CompareData::CompareData (SharedPtr<DataBlock> a, SharedPtr<DataBlock> b)
	: Operation	("CompareData")
	, m_a		(a)
	, m_b		(b)
{
	readObject(SharedPtr<Object>(a));
	readObject(SharedPtr<Object>(b));
}